

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O2

bool sptk::ComputePercentagePointOfTDistribution
               (double probability,int degrees_of_freedom,double *percentage_point)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  undefined4 *puVar5;
  ulong uVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  double dVar14;
  double dVar15;
  initializer_list<int> __l;
  double computed_probability;
  double local_d8;
  double local_c0;
  double z;
  double local_b0;
  vector<int,_std::allocator<int>_> parameters;
  vector<double,_std::allocator<double>_> term;
  
  bVar13 = 0;
  if ((percentage_point != (double *)0x0 && 0 < degrees_of_freedom) &&
      (0.0 < probability && probability < 1.0)) {
    if ((probability == 0.5) && (!NAN(probability))) {
      *percentage_point = 0.0;
      return true;
    }
    local_d8 = probability;
    bVar1 = ComputePercentagePointOfStandardNormalDistribution(probability,&z);
    dVar15 = z;
    if (bVar1) {
      puVar5 = &DAT_0010e868;
      pvVar7 = &term;
      for (lVar3 = 0x19; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined4 *)
         &(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start = *puVar5;
        puVar5 = puVar5 + (ulong)bVar13 * -2 + 1;
        pvVar7 = (vector<double,_std::allocator<double>_> *)((long)pvVar7 + (ulong)bVar13 * -8 + 4);
      }
      __l._M_len = 0x19;
      __l._M_array = (iterator)&term;
      std::vector<int,_std::allocator<int>_>::vector
                (&parameters,__l,(allocator_type *)&computed_probability);
      std::vector<double,_std::allocator<double>_>::vector
                (&term,5,(allocator_type *)&computed_probability);
      uVar4 = (ulong)((long)term.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)term.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3;
      uVar6 = 0;
      uVar8 = 0;
      if (0 < (int)uVar4) {
        uVar8 = uVar4 & 0xffffffff;
      }
      lVar3 = 1;
      iVar9 = 2;
      lVar11 = 0;
      for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
        iVar10 = (int)lVar11;
        lVar12 = (long)iVar10;
        dVar14 = (double)parameters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar12];
        term.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6] = dVar14;
        for (lVar11 = 0; (int)lVar3 != (int)lVar11; lVar11 = lVar11 + 1) {
          dVar14 = dVar14 * dVar15 * dVar15 +
                   (double)parameters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar12 + lVar11 + 1];
        }
        lVar11 = lVar3 + lVar12 + 2;
        term.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6] =
             dVar14 / (double)parameters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar10 + iVar9];
        lVar3 = lVar3 + 1;
        iVar9 = iVar9 + 1;
      }
      dVar15 = (double)degrees_of_freedom;
      dVar14 = 0.0;
      for (uVar4 = uVar4 & 0xffffffff; *percentage_point = dVar14, 0 < (int)uVar4; uVar4 = uVar4 - 1
          ) {
        dVar14 = (dVar14 + term.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar4 - 1]) * (1.0 / dVar15);
      }
      *percentage_point = (dVar14 + 1.0) * z;
      local_d8 = 1.0 - local_d8;
      dVar14 = log10(local_d8);
      bVar1 = true;
      if (dVar15 <= dVar14 * dVar14 + 3.0) {
        bVar2 = ComputeProbabilityOfTDistribution
                          (*percentage_point,degrees_of_freedom,&computed_probability);
        if (bVar2) {
          local_c0 = (double)(degrees_of_freedom + 1);
          local_b0 = log(local_c0 / (*percentage_point * *percentage_point + dVar15));
          dVar14 = log(dVar15 / (local_c0 * 6.283185307179586));
          local_d8 = computed_probability - local_d8;
          dVar15 = exp((dVar14 + local_b0 * local_c0 + -1.0 + -1.0 / (local_c0 * 6.0 * dVar15)) *
                       0.5);
          *percentage_point = *percentage_point - local_d8 / dVar15;
        }
        else {
          bVar1 = false;
        }
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&term.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&parameters.super__Vector_base<int,_std::allocator<int>_>);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ComputePercentagePointOfTDistribution(double probability,
                                           int degrees_of_freedom,
                                           double* percentage_point) {
  if (probability <= 0.0 || 1.0 <= probability || degrees_of_freedom <= 0 ||
      NULL == percentage_point) {
    return false;
  }

  if (0.5 == probability) {
    *percentage_point = 0.0;
    return true;
  }

  double z;
  if (!ComputePercentagePointOfStandardNormalDistribution(probability, &z)) {
    return false;
  }
  const double z_squared(z * z);
  const std::vector<int> parameters{1,     1,     4,     5,     16,  3,   96,
                                    3,     19,    17,    -15,   384, 79,  776,
                                    1482,  -1920, -945,  92160, 27,  339, 930,
                                    -1782, -765,  17955, 368640};

  std::vector<double> term(5);
  for (int i(0), index(0); i < static_cast<int>(term.size()); ++i) {
    term[i] = parameters[index++];
    for (int j(0); j <= i; ++j) {
      term[i] = term[i] * z_squared + parameters[index++];
    }
    term[i] /= parameters[index++];
  }

  const double inverse_degrees_of_freedom(1.0 / degrees_of_freedom);
  *percentage_point = 0.0;
  for (int i(static_cast<int>(term.size()) - 1); 0 <= i; --i) {
    *percentage_point =
        (*percentage_point + term[i]) * inverse_degrees_of_freedom;
  }
  *percentage_point = (*percentage_point + 1.0) * z;

  if (degrees_of_freedom <=
      std::pow(std::log10(1.0 - probability), 2.0) + 3.0) {
    const double n(degrees_of_freedom + 1);
    double computed_probability;
    if (!ComputeProbabilityOfTDistribution(
            *percentage_point, degrees_of_freedom, &computed_probability)) {
      return false;
    }
    const double percentage_point_squared(*percentage_point *
                                          *percentage_point);
    const double tmp1(
        std::log(n / (degrees_of_freedom + percentage_point_squared)));
    const double tmp2(std::log(degrees_of_freedom / (n * sptk::kTwoPi)));
    const double tmp3(1.0 / (6.0 * n * degrees_of_freedom));
    const double delta((computed_probability - (1.0 - probability)) /
                       std::exp((n * tmp1 + tmp2 - 1.0 - tmp3) / 2.0));
    *percentage_point -= delta;
  }
  return true;
}